

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quat.c
# Opt level: O0

void glmc_quat_lerp(float *from,float *to,float t,float *dest)

{
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float *dest_local;
  float t_local;
  float *to_local;
  float *from_local;
  vec4 v;
  vec4 s;
  
  local_c8 = (float)*(undefined8 *)to;
  fStack_c4 = (float)((ulong)*(undefined8 *)to >> 0x20);
  fStack_c0 = (float)*(undefined8 *)(to + 2);
  fStack_bc = (float)((ulong)*(undefined8 *)(to + 2) >> 0x20);
  local_d8 = (float)*(undefined8 *)from;
  fStack_d4 = (float)((ulong)*(undefined8 *)from >> 0x20);
  fStack_d0 = (float)*(undefined8 *)(from + 2);
  fStack_cc = (float)((ulong)*(undefined8 *)(from + 2) >> 0x20);
  local_138 = (float)*(undefined8 *)from;
  fStack_134 = (float)((ulong)*(undefined8 *)from >> 0x20);
  fStack_130 = (float)*(undefined8 *)(from + 2);
  fStack_12c = (float)((ulong)*(undefined8 *)(from + 2) >> 0x20);
  *(ulong *)dest =
       CONCAT44(fStack_134 + t * (fStack_c4 - fStack_d4),local_138 + t * (local_c8 - local_d8));
  *(ulong *)(dest + 2) =
       CONCAT44(fStack_12c + t * (fStack_bc - fStack_cc),fStack_130 + t * (fStack_c0 - fStack_d0));
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_quat_lerp(versor from, versor to, float t, versor dest) {
  glm_quat_lerp(from, to, t, dest);
}